

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O3

void __thiscall S2Cell::S2Cell(S2Cell *this,S2CellId id)

{
  ulong uVar1;
  int iVar2;
  int ij [2];
  int orientation;
  int local_4c;
  int local_48;
  int8 local_44 [4];
  S2CellId local_40;
  R2Rect local_38;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002bb7c8;
  (this->uv_).bounds_[0].bounds_.c_[0] = 1.0;
  (this->uv_).bounds_[0].bounds_.c_[1] = 0.0;
  (this->uv_).bounds_[1].bounds_.c_[0] = 1.0;
  (this->uv_).bounds_[1].bounds_.c_[1] = 0.0;
  (this->id_).id_ = id.id_;
  local_40.id_ = id.id_;
  iVar2 = S2CellId::ToFaceIJOrientation(&local_40,&local_4c,&local_48,(int *)local_44);
  this->face_ = (int8)iVar2;
  this->orientation_ = local_44[0];
  if (local_40.id_ != 0) {
    uVar1 = 0;
    if (local_40.id_ != 0) {
      for (; (local_40.id_ >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    iVar2 = 0x1e - ((uint)(uVar1 >> 1) & 0x7fffffff);
    this->level_ = (int8)iVar2;
    S2CellId::IJLevelToBoundUV(&local_38,&local_4c,iVar2);
    (this->uv_).bounds_[1].bounds_.c_[0] = local_38.bounds_[1].bounds_.c_[0];
    (this->uv_).bounds_[1].bounds_.c_[1] = local_38.bounds_[1].bounds_.c_[1];
    (this->uv_).bounds_[0].bounds_.c_[0] = local_38.bounds_[0].bounds_.c_[0];
    (this->uv_).bounds_[0].bounds_.c_[1] = local_38.bounds_[0].bounds_.c_[1];
    return;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
             ,0x223,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_38.bounds_[0].bounds_.c_[1],"Check failed: id_ != 0 ",0x17);
  abort();
}

Assistant:

S2Cell::S2Cell(S2CellId id) {
  id_ = id;
  int ij[2], orientation;
  face_ = id.ToFaceIJOrientation(&ij[0], &ij[1], &orientation);
  orientation_ = orientation;  // Compress int to a byte.
  level_ = id.level();
  uv_ = S2CellId::IJLevelToBoundUV(ij, level_);
}